

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void drawnumber_key(void *z,t_symbol *keysym,t_floatarg fkey)

{
  t_template *template;
  _glist *owner;
  t_scalar *sc;
  int iVar1;
  int iVar2;
  t_symbol *ptVar3;
  size_t sVar4;
  t_float tVar5;
  double local_430;
  double newf;
  t_atom at;
  char sbuf [1000];
  int key;
  t_drawnumber *x;
  t_floatarg fkey_local;
  t_symbol *keysym_local;
  void *z_local;
  
  iVar1 = (int)fkey;
  iVar2 = gpointer_check((t_gpointer *)((pd_maininstance.pd_gui)->i_template + 0xf0),0);
  if (iVar2 == 0) {
    post("drawnumber_motion: scalar disappeared");
  }
  else if (iVar1 != 0) {
    if (*(int *)((pd_maininstance.pd_gui)->i_template + 0x108) == 1) {
      if (*(int *)((pd_maininstance.pd_gui)->i_template + 0x10c) == 0) {
        ptVar3 = template_getsymbol(*(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8),
                                    *(t_symbol **)((long)z + 0x30),
                                    *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0),1);
        strncpy((char *)&at.a_w.w_index,ptVar3->s_name,1000);
      }
      else {
        at.a_w.w_index._0_1_ = 0;
      }
      if (iVar1 == 8) {
        if (at.a_w.w_index._0_1_ != '\0') {
          sVar4 = strlen((char *)&at.a_w.w_index);
          sbuf[sVar4 - 9] = '\0';
        }
      }
      else {
        sVar4 = strlen((char *)&at.a_w.w_index);
        sbuf[sVar4 - 7] = '\0';
        sVar4 = strlen((char *)&at.a_w.w_index);
        sbuf[sVar4 - 8] = (char)iVar1;
      }
    }
    else if (*(int *)((pd_maininstance.pd_gui)->i_template + 0x108) == 0) {
      if (*(int *)((pd_maininstance.pd_gui)->i_template + 0x10c) == 0) {
        tVar5 = template_getfloat(*(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8),
                                  *(t_symbol **)((long)z + 0x30),
                                  *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0),1);
        sprintf((char *)&at.a_w.w_index,"%g",(double)tVar5);
      }
      else {
        at.a_w.w_index._0_1_ = 0;
      }
      *(uint *)((pd_maininstance.pd_gui)->i_template + 0x10c) = (uint)(iVar1 == 10);
      if (iVar1 == 8) {
        if (at.a_w.w_index._0_1_ != '\0') {
          sVar4 = strlen((char *)&at.a_w.w_index);
          sbuf[sVar4 - 9] = '\0';
        }
      }
      else {
        sVar4 = strlen((char *)&at.a_w.w_index);
        sbuf[sVar4 - 7] = '\0';
        sVar4 = strlen((char *)&at.a_w.w_index);
        sbuf[sVar4 - 8] = (char)iVar1;
      }
      iVar1 = __isoc99_sscanf(&at.a_w,"%lg",&local_430);
      if (iVar1 < 1) {
        local_430 = 0.0;
      }
      template_setfloat(*(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8),
                        *(t_symbol **)((long)z + 0x30),
                        *(t_word **)((pd_maininstance.pd_gui)->i_template + 0xe0),(float)local_430,1
                       );
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd0) != 0) {
        template = *(t_template **)((pd_maininstance.pd_gui)->i_template + 0xe8);
        owner = *(_glist **)((pd_maininstance.pd_gui)->i_template + 200);
        sc = *(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0);
        ptVar3 = gensym("change");
        template_notifyforscalar(template,owner,sc,ptVar3,1,(t_atom *)&newf);
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd0) != 0) {
        scalar_redraw(*(t_scalar **)((pd_maininstance.pd_gui)->i_template + 0xd0),
                      *(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
      }
      if (*(long *)((pd_maininstance.pd_gui)->i_template + 0xd8) != 0) {
        array_redraw(*(_array **)((pd_maininstance.pd_gui)->i_template + 0xd8),
                     *(_glist **)((pd_maininstance.pd_gui)->i_template + 200));
      }
    }
    else {
      post("typing at text fields not yet implemented");
    }
  }
  return;
}

Assistant:

static void drawnumber_key(void *z, t_symbol *keysym, t_floatarg fkey)
{
    t_drawnumber *x = (t_drawnumber *)z;
    int key = fkey;
    char sbuf[MAXPDSTRING];
    t_atom at;
    if (!gpointer_check(&TEMPLATE->drawnumber_motion_gpointer, 0))
    {
        post("drawnumber_motion: scalar disappeared");
        return;
    }
    if (key == 0)
        return;
    if (TEMPLATE->drawnumber_motion_type == DT_SYMBOL)
    {
            /* key entry for a symbol field */
        if (TEMPLATE->drawnumber_motion_firstkey)
            sbuf[0] = 0;
        else strncpy(sbuf,
            template_getsymbol(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, 1)->s_name,
                MAXPDSTRING);
        sbuf[MAXPDSTRING-1] = 0;
        if (key == '\b')
        {
            if (*sbuf)
                sbuf[strlen(sbuf)-1] = 0;
        }
        else
        {
            sbuf[strlen(sbuf)+1] = 0;
            sbuf[strlen(sbuf)] = key;
        }
    }
    else if (TEMPLATE->drawnumber_motion_type == DT_FLOAT)
    {
            /* key entry for a numeric field.  This is just a stopgap. */
        double newf;
        if (TEMPLATE->drawnumber_motion_firstkey)
            sbuf[0] = 0;
        else sprintf(sbuf, "%g",
            template_getfloat(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, 1));
        TEMPLATE->drawnumber_motion_firstkey = (key == '\n');
        if (key == '\b')
        {
            if (*sbuf)
                sbuf[strlen(sbuf)-1] = 0;
        }
        else
        {
            sbuf[strlen(sbuf)+1] = 0;
            sbuf[strlen(sbuf)] = key;
        }
        if (sscanf(sbuf, "%lg", &newf) < 1)
            newf = 0;
        template_setfloat(TEMPLATE->drawnumber_motion_template,
            x->x_fieldname, TEMPLATE->drawnumber_motion_wp, (t_float)newf, 1);
        if (TEMPLATE->drawnumber_motion_scalar)
            template_notifyforscalar(TEMPLATE->drawnumber_motion_template,
                TEMPLATE->drawnumber_motion_glist,
                    TEMPLATE->drawnumber_motion_scalar,
                    gensym("change"), 1, &at);
        if (TEMPLATE->drawnumber_motion_scalar)
            scalar_redraw(TEMPLATE->drawnumber_motion_scalar,
                TEMPLATE->drawnumber_motion_glist);
        if (TEMPLATE->drawnumber_motion_array)
            array_redraw(TEMPLATE->drawnumber_motion_array,
                TEMPLATE->drawnumber_motion_glist);
    }
    else post("typing at text fields not yet implemented");
}